

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_datagram_socket.hpp
# Opt level: O0

size_t __thiscall
asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::send_to<asio::const_buffers_1>
          (basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *this,
          const_buffers_1 *buffers,endpoint_type *destination)

{
  size_t sVar1;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
  *in_RDI;
  size_t s;
  error_code ec;
  char *in_stack_ffffffffffffffb8;
  
  CLI::std::error_code::error_code((error_code *)in_RDI);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  get_service(in_RDI);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  get_implementation(in_RDI);
  sVar1 = asio::detail::reactive_socket_service<asio::ip::udp>::send_to<asio::const_buffers_1>
                    ((reactive_socket_service<asio::ip::udp> *)this,(implementation_type *)buffers,
                     (const_buffers_1 *)destination,(endpoint_type *)ec._M_cat,ec._4_4_,
                     (error_code *)s);
  asio::detail::throw_error((error_code *)in_RDI,in_stack_ffffffffffffffb8);
  return sVar1;
}

Assistant:

std::size_t send_to(const ConstBufferSequence& buffers,
      const endpoint_type& destination)
  {
    asio::error_code ec;
    std::size_t s = this->impl_.get_service().send_to(
        this->impl_.get_implementation(), buffers, destination, 0, ec);
    asio::detail::throw_error(ec, "send_to");
    return s;
  }